

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.cc
# Opt level: O0

void __thiscall trng::mrg2::seed(mrg2 *this,unsigned_long s)

{
  int64_t t;
  unsigned_long s_local;
  mrg2 *this_local;
  
  t = (long)s % 0x7fffffff;
  if (t < 0) {
    t = t + 0x7fffffff;
  }
  (this->S).r[0] = (int)t;
  (this->S).r[1] = 1;
  return;
}

Assistant:

void mrg2::seed(unsigned long s) {
    int64_t t(s);
    t %= modulus;
    if (t < 0)
      t += modulus;
    S.r[0] = static_cast<result_type>(t);
    S.r[1] = 1;
  }